

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.cpp
# Opt level: O0

string * pprint__abi_cxx11_(string *__return_storage_ptr__,thing *t,int i)

{
  ulong uVar1;
  size_type sVar2;
  reference pptVar3;
  char cVar4;
  int local_8c;
  undefined1 local_88 [4];
  int j_2;
  int local_64;
  token *ptStack_60;
  int j_1;
  expression *e;
  int local_24;
  undefined1 local_1d;
  int j;
  token *ptStack_18;
  int i_local;
  thing *t_local;
  string *s;
  
  local_1d = 0;
  j = i;
  ptStack_18 = (token *)t;
  t_local = (thing *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_24 = 0; cVar4 = (char)__return_storage_ptr__, local_24 < j; local_24 = local_24 + 1) {
    std::__cxx11::string::push_back(cVar4);
  }
  if ((ptStack_18->super_thing).t == TOKEN) {
    parser::token::get_content_abi_cxx11_((string *)&e,ptStack_18);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
  }
  else if ((ptStack_18->super_thing).t == EXPRESSION) {
    std::__cxx11::string::push_back(cVar4);
    std::__cxx11::string::push_back(cVar4);
    ptStack_60 = ptStack_18;
    for (local_64 = 0; uVar1 = (ulong)local_64,
        sVar2 = std::vector<parser::thing_*,_std::allocator<parser::thing_*>_>::size
                          ((vector<parser::thing_*,_std::allocator<parser::thing_*>_> *)
                           &ptStack_60->content), uVar1 < sVar2; local_64 = local_64 + 1) {
      pptVar3 = std::vector<parser::thing_*,_std::allocator<parser::thing_*>_>::operator[]
                          ((vector<parser::thing_*,_std::allocator<parser::thing_*>_> *)
                           &ptStack_60->content,(long)local_64);
      pprint__abi_cxx11_((string *)local_88,*pptVar3,j + 1);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_88);
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::push_back(cVar4);
    }
    for (local_8c = 0; local_8c < j; local_8c = local_8c + 1) {
      std::__cxx11::string::push_back(cVar4);
    }
    std::__cxx11::string::push_back(cVar4);
    std::__cxx11::string::push_back(cVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string pprint_(parser::thing *t, int i) {

  std::string s;

  for (int j = 0; j < i; j++) {
    s.push_back('\t');
  }

  if (t->t==parser::type::TOKEN) {
    s += ((static_cast<parser::token *>(t))->get_content());
  } else if (t->t==parser::type::EXPRESSION) {

    s.push_back('(');
    s.push_back('\n');

    parser::expression *e = static_cast<parser::expression *>(t);

    for (int j = 0; j < e->things.size(); j++) {
      s += pprint_(e->things[j], i + 1);
      s.push_back('\n');
    }

    for (int j = 0; j < i; j++) {
      s.push_back('\t');
    }

    s.push_back(')');
    s.push_back('\n');

  }

  return s;

}